

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,char *value)

{
  format_error *this;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar1;
  size_t in_RCX;
  basic_string_view<char> value_00;
  basic_string_view<char> local_58;
  detail *local_48;
  size_t local_38;
  size_t length;
  char *local_20;
  char *value_local;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_local;
  
  local_20 = value;
  value_local = (char *)out.container;
  if (value == (char *)0x0) {
    this = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this,"string pointer is null");
    __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
  }
  local_38 = std::char_traits<char>::length(value);
  local_48 = (detail *)value_local;
  basic_string_view<char>::basic_string_view(&local_58,local_20,local_38);
  value_00.size_ = in_RCX;
  value_00.data_ = (char *)local_58.size_;
  bVar1 = write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                    (local_48,(back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_58.data_,
                     value_00);
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar1.container;
}

Assistant:

OutputIt write(OutputIt out, const Char* value) {
  if (!value) {
    FMT_THROW(format_error("string pointer is null"));
  } else {
    auto length = std::char_traits<Char>::length(value);
    out = write(out, basic_string_view<Char>(value, length));
  }
  return out;
}